

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_Font::Dump(ON_Font *this,ON_TextLog *dump)

{
  bool bVar1;
  Member MVar2;
  bool bVar3;
  Type TVar4;
  wchar_t *pwVar5;
  ON_SHA1_Hash *pOVar6;
  ON_FontGlyphCache *pOVar7;
  ON_FontMetrics *pOVar8;
  wchar_t in_ECX;
  ulong uVar9;
  undefined1 in_R8B;
  ON_wString *pOVar10;
  wchar_t *pwVar11;
  bool bVar12;
  ON_wString s;
  ON_wString en_family_name;
  ON_wString en_windows_logfont_name;
  ON_wString en_postscript_name;
  ON_wString en_face_name;
  ON_wString windows_logfont_name;
  ON_wString quartet_description;
  ON_wString postscript_name;
  ON_wString face_name;
  ON_wString description;
  ON_wString rich_text_name;
  ON_FontFaceQuartet q;
  ON_wString local_e8;
  ON_wString local_e0;
  undefined1 local_d8 [16];
  ON_wString local_c8;
  ON_wString local_c0;
  ON_wString local_b8;
  undefined1 local_b0 [24];
  undefined1 local_98 [32];
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  ON__UINT8 aOStack_6c [4];
  ON__UINT8 local_68 [4];
  ON__UINT8 aOStack_64 [4];
  ON__UINT8 aOStack_60 [4];
  ON__UINT8 aOStack_5c [4];
  undefined1 local_58 [48];
  
  bVar1 = ON_TextLog::IsTextHash(dump);
  ON_wString::ON_wString(&local_e8);
  if (bVar1) {
    ON_TextLog::Print(dump,L"Font family name = ...\n");
    ON_TextLog::PushIndent(dump);
    ON_TextLog::Print(dump,
                      L"The font face name and other properties depend on the platform \nor the fonts installed on a particular computer. Information like \nthis is omitted from dumps used for SHA-1 hash caluculations so \nhash values from different platforms and computers can be compared. \n"
                     );
    goto LAB_0048bb16;
  }
  Description((ON_Font *)local_98,(NameLocale)this,L'\0',in_ECX,(bool)in_R8B,false);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
  ON_TextLog::Print(dump,L"Font description = \"%ls\"\n",pwVar5);
  ON_TextLog::PushIndent(dump);
  bVar3 = ON_wString::IsNotEmpty(&this->m_loc_family_name);
  pOVar10 = &this->m_loc_family_name;
  if (!bVar3) {
    pOVar10 = &this->m_en_family_name;
  }
  ON_wString::ON_wString((ON_wString *)(local_58 + 8),pOVar10);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_58 + 8));
  ON_TextLog::Print(dump,L"Family name = \"%ls\"\n",pwVar5);
  ON_wString::ON_wString((ON_wString *)local_d8,&this->m_en_family_name);
  bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_d8);
  if ((bVar3) && (bVar3 = ::operator!=((ON_wString *)local_d8,(ON_wString *)(local_58 + 8)), bVar3))
  {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_d8);
    ON_TextLog::Print(dump,L"Family name (English)= \"%ls\"\n",pwVar5);
  }
  bVar3 = ON_wString::IsNotEmpty(&this->m_loc_face_name);
  pOVar10 = &this->m_loc_face_name;
  if (!bVar3) {
    pOVar10 = &this->m_en_face_name;
  }
  ON_wString::ON_wString((ON_wString *)(local_b0 + 0x10),pOVar10);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_b0 + 0x10));
  ON_TextLog::Print(dump,L"Face name = \"%ls\"\n",pwVar5);
  ON_wString::ON_wString(&local_c0,&this->m_en_face_name);
  bVar3 = ON_wString::IsNotEmpty(&local_c0);
  if ((bVar3) && (bVar3 = ::operator!=(&local_c0,(ON_wString *)(local_b0 + 0x10)), bVar3)) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_c0);
    ON_TextLog::Print(dump,L"Face name (English)= \"%ls\"\n",pwVar5);
  }
  bVar3 = ON_wString::IsNotEmpty(&this->m_loc_postscript_name);
  pOVar10 = &this->m_loc_postscript_name;
  if (!bVar3) {
    pOVar10 = &this->m_en_postscript_name;
  }
  ON_wString::ON_wString((ON_wString *)(local_b0 + 8),pOVar10);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_b0 + 8));
  ON_TextLog::Print(dump,L"PostScript name = \"%ls\"\n",pwVar5);
  ON_wString::ON_wString(&local_c8,&this->m_en_postscript_name);
  bVar3 = ON_wString::IsNotEmpty(&local_c8);
  if ((bVar3) && (bVar3 = ::operator!=(&local_c8,(ON_wString *)(local_b0 + 8)), bVar3)) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_c8);
    ON_TextLog::Print(dump,L"PostScript name (English)= \"%ls\"\n",pwVar5);
  }
  QuartetDescription((ON_Font *)local_b0);
  bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_b0);
  if (bVar3) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
    ON_TextLog::Print(dump,L"Quartet = %ls\n",pwVar5);
  }
  bVar3 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  pOVar10 = &this->m_loc_windows_logfont_name;
  if (!bVar3) {
    pOVar10 = &this->m_en_windows_logfont_name;
  }
  ON_wString::ON_wString(&local_b8,pOVar10);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_b8);
  ON_TextLog::Print(dump,L"Windows LOGFONT name = \"%ls\"\n",pwVar5);
  ON_wString::ON_wString((ON_wString *)(local_d8 + 8),&this->m_en_windows_logfont_name);
  bVar3 = ON_wString::IsNotEmpty((ON_wString *)(local_d8 + 8));
  if ((bVar3) && (bVar3 = ::operator!=((ON_wString *)(local_d8 + 8),&local_b8), bVar3)) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_d8 + 8));
    ON_TextLog::Print(dump,L"Windows LOGFONT name (English)= \"%ls\"\n",pwVar5);
  }
  RichTextFontName((ON_Font *)local_58,this,false);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_58);
  ON_TextLog::Print(dump,L"Rich text name = \"%ls\"\n",pwVar5);
  bVar3 = this->m_runtime_serial_number != 0;
  bVar12 = ((uint)this->m_managed_installed_font_and_bits & 3) == 2;
  if ((bVar12 && bVar3) &&
     (uVar9 = this->m_managed_installed_font_and_bits & 0xfffffffffffffffc, uVar9 != 0)) {
    Description((ON_Font *)&local_e0,(NameLocale)uVar9,L'\0',(uint)(bVar12 && bVar3),(bool)in_R8B,
                false);
    pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e0);
    ON_TextLog::Print(dump,L"Installed substitute = %ls\n",pwVar5);
    ON_wString::~ON_wString(&local_e0);
  }
  ON_wString::operator=(&local_e8,&ON_wString::EmptyString);
  switch(this->m_font_origin) {
  case Unset:
    goto switchD_0048b963_caseD_0;
  case Unknown:
    pwVar5 = L"Unknown";
    break;
  case WindowsFont:
    pwVar5 = L"Windows Font";
    break;
  case AppleFont:
    pwVar5 = L"Apple Font";
    break;
  default:
    ON_wString::FormatToString((wchar_t *)&local_e0,L"%u");
    ON_wString::operator=(&local_e8,&local_e0);
    ON_wString::~ON_wString(&local_e0);
    goto switchD_0048b963_caseD_0;
  }
  ON_wString::operator=(&local_e8,pwVar5);
switchD_0048b963_caseD_0:
  bVar3 = ON_wString::IsNotEmpty(&local_e8);
  if (bVar3) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e8);
    ON_TextLog::Print(dump,L"Origin = %ls\n",pwVar5);
  }
  ON_wString::operator=(&local_e8,&ON_wString::EmptyString);
  TVar4 = OutlineFigureType(this);
  switch(TVar4) {
  case Unset:
  case Unknown:
    goto switchD_0048ba11_caseD_0;
  case SingleStroke:
    pwVar5 = L"Engraving - single stroke";
    break;
  case DoubleStroke:
    pwVar5 = L"Engraving - double stroke";
    break;
  case Perimeter:
    pwVar5 = L"Perimeter";
    break;
  case NotPerimeter:
    pwVar5 = L"Not a perimeter";
    break;
  default:
    ON_wString::FormatToString((wchar_t *)&local_e0,L"%u");
    ON_wString::operator=(&local_e8,&local_e0);
    ON_wString::~ON_wString(&local_e0);
    goto switchD_0048ba11_caseD_0;
  case Mixed:
    pwVar5 = L"Mixed";
  }
  ON_wString::operator=(&local_e8,pwVar5);
switchD_0048ba11_caseD_0:
  bVar3 = ON_wString::IsNotEmpty(&local_e8);
  if (bVar3) {
    pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e8);
    ON_TextLog::Print(dump,L"Outline type = %ls\n",pwVar5);
  }
  ON_wString::~ON_wString((ON_wString *)local_58);
  ON_wString::~ON_wString((ON_wString *)(local_d8 + 8));
  ON_wString::~ON_wString(&local_b8);
  ON_wString::~ON_wString((ON_wString *)local_b0);
  ON_wString::~ON_wString(&local_c8);
  ON_wString::~ON_wString((ON_wString *)(local_b0 + 8));
  ON_wString::~ON_wString(&local_c0);
  ON_wString::~ON_wString((ON_wString *)(local_b0 + 0x10));
  ON_wString::~ON_wString((ON_wString *)local_d8);
  ON_wString::~ON_wString((ON_wString *)(local_58 + 8));
  ON_wString::~ON_wString((ON_wString *)local_98);
LAB_0048bb16:
  if ((this->m_point_size <= 0.0) || (10000000000.0 <= this->m_point_size)) {
    ON_TextLog::Print(dump,L"PointSize = annotation default\n");
  }
  else {
    ON_TextLog::Print(dump,L"PointSize = %g\n");
  }
  FontQuartet((ON_FontFaceQuartet *)(local_58 + 8),this);
  MVar2 = ON_FontFaceQuartet::QuartetMember((ON_FontFaceQuartet *)(local_58 + 8),this);
  switch(MVar2) {
  case Regular:
    ON_wString::ON_wString((ON_wString *)local_98,(ON_wString *)(local_58 + 8));
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
    ON_TextLog::Print(dump,"Quartet: %ls (Regular member)\n",pwVar5);
    break;
  case Bold:
    ON_wString::ON_wString((ON_wString *)local_98,(ON_wString *)(local_58 + 8));
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold member)\n",pwVar5);
    break;
  case Italic:
    ON_wString::ON_wString((ON_wString *)local_98,(ON_wString *)(local_58 + 8));
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
    ON_TextLog::Print(dump,"Quartet: %ls (Italic member)\n",pwVar5);
    break;
  case BoldItalic:
    ON_wString::ON_wString((ON_wString *)local_98,(ON_wString *)(local_58 + 8));
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold-Italic member)\n",pwVar5);
    break;
  default:
    ON_TextLog::Print(dump,"Quartet: None\n");
    goto LAB_0048bc7c;
  }
  ON_wString::~ON_wString((ON_wString *)local_98);
LAB_0048bc7c:
  if ((ulong)this->m_font_weight < 10) {
    pwVar5 = *(wchar_t **)(&DAT_0081e850 + (ulong)this->m_font_weight * 8);
  }
  else {
    pwVar5 = L"";
  }
  ON_wString::operator=(&local_e8,pwVar5);
  bVar3 = ON_wString::IsEmpty(&local_e8);
  if (bVar3) {
    ON_wString::FormatToString((wchar_t *)local_98,L"%u",(ulong)this->m_font_weight);
    ON_wString::operator=(&local_e8,(ON_wString *)local_98);
    ON_wString::~ON_wString((ON_wString *)local_98);
  }
  if ((this->m_simulated & 2) != 0) {
    ON_wString::operator+=(&local_e8,L" (simulated)");
  }
  pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e8);
  ON_TextLog::Print(dump,L"Weight = %ls\n",pwVar5);
  if ((ulong)this->m_font_stretch < 10) {
    pwVar5 = (wchar_t *)(&PTR_anon_var_dwarf_25c401_0081e8c0)[this->m_font_stretch];
  }
  else {
    pwVar5 = L"";
  }
  ON_wString::operator=(&local_e8,pwVar5);
  bVar3 = ON_wString::IsEmpty(&local_e8);
  if (bVar3) {
    ON_wString::FormatToString((wchar_t *)local_98,L"%u",(ulong)this->m_font_stretch);
    ON_wString::operator=(&local_e8,(ON_wString *)local_98);
    ON_wString::~ON_wString((ON_wString *)local_98);
  }
  if ((this->m_simulated & 4) != 0) {
    ON_wString::operator+=(&local_e8,L" (simulated)");
  }
  pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e8);
  ON_TextLog::Print(dump,L"Stretch = %ls\n",pwVar5);
  if ((ulong)this->m_font_style < 4) {
    pwVar5 = (wchar_t *)(&PTR_anon_var_dwarf_25c470_0081e8a0)[this->m_font_style];
  }
  else {
    pwVar5 = L"";
  }
  ON_wString::operator=(&local_e8,pwVar5);
  bVar3 = ON_wString::IsEmpty(&local_e8);
  if (bVar3) {
    ON_wString::FormatToString((wchar_t *)local_98,L"%u",(ulong)this->m_font_style);
    ON_wString::operator=(&local_e8,(ON_wString *)local_98);
    ON_wString::~ON_wString((ON_wString *)local_98);
  }
  if ((this->m_simulated & 8) != 0) {
    ON_wString::operator+=(&local_e8,L" (simulated)");
  }
  pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_e8);
  ON_TextLog::Print(dump,L"Style = %ls\n",pwVar5);
  pwVar11 = L"false";
  pwVar5 = L"false";
  if (this->m_font_bUnderlined != false) {
    pwVar5 = L"true";
  }
  ON_TextLog::Print(dump,L"Underlined = %ls\n",pwVar5);
  pwVar5 = L"false";
  if (this->m_font_bStrikethrough != false) {
    pwVar5 = L"true";
  }
  ON_TextLog::Print(dump,L"Strikethrough = %ls\n",pwVar5);
  if (this->m_logfont_charset == '\x02') {
    pwVar11 = L"true";
  }
  ON_TextLog::Print(dump,L"Symbol font = %ls\n",pwVar11);
  TVar4 = OutlineFigureType(this);
  if (TVar4 == DoubleStroke) {
    pwVar5 = L"Engraving font = Double-stroke\n";
  }
  else {
    if (TVar4 != SingleStroke) goto LAB_0048bee9;
    pwVar5 = L"Engraving font = Single-stroke\n";
  }
  ON_TextLog::Print(dump,pwVar5);
LAB_0048bee9:
  if (NoFit < (this->m_panose1).m_family_kind) {
    ON_PANOSE1::Dump(&this->m_panose1,dump);
  }
  if (!bVar1) {
    pOVar6 = FontCharacteristicsHash(this);
    ON_SHA1_Hash::ToString((ON_SHA1_Hash *)local_d8,SUB81(pOVar6,0));
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_d8);
    ON_TextLog::Print(dump,L"Font characteristics SHA-1 hash = %ls\n",pwVar5);
    if (this->m_runtime_serial_number != 0) {
      if (this == &Default) {
        pwVar5 = L"Managed font <%u> (ON_Font::Default)\n";
      }
      else {
        pwVar5 = L"Managed font <%u> (face installed on device)\n";
        if ((this->m_font_type != InstalledFont) &&
           ((this->m_font_type != ManagedFont ||
            ((this->m_managed_installed_font_and_bits & 3) != 1)))) {
          pwVar5 = L"Managed font <%u> (face not installed on device)\n";
        }
      }
      ON_TextLog::Print(dump,pwVar5);
      pOVar7 = FontGlyphCache(this,false);
      if (pOVar7 == (ON_FontGlyphCache *)0x0) {
        pOVar8 = &ON_FontMetrics::Unset;
      }
      else {
        pOVar8 = &pOVar7->m_font_unit_metrics;
      }
      local_98._0_8_ = *(undefined8 *)pOVar8;
      local_98._8_8_ = *(undefined8 *)&pOVar8->m_descent;
      local_98._16_8_ = *(undefined8 *)&pOVar8->m_ascent_of_capital;
      local_98._24_8_ = *(undefined8 *)&pOVar8->m_strikeout_position;
      local_78 = pOVar8->m_underscore_position;
      iStack_74 = pOVar8->m_reserved1;
      uStack_70 = *(undefined4 *)&pOVar8->m_reserved2;
      aOStack_6c = *(ON__UINT8 (*) [4])((long)&pOVar8->m_reserved2 + 4);
      local_68 = *(ON__UINT8 (*) [4])&pOVar8->m_reserved3;
      aOStack_64 = *(ON__UINT8 (*) [4])((long)&pOVar8->m_reserved3 + 4);
      aOStack_60 = *(ON__UINT8 (*) [4])&pOVar8->m_reserved_ptr;
      aOStack_5c = *(ON__UINT8 (*) [4])((long)&pOVar8->m_reserved_ptr + 4);
      ON_TextLog::Print(dump,L"Font metrics:");
      bVar1 = ON_FontMetrics::IsUnset((ON_FontMetrics *)local_98);
      if (bVar1) {
        ON_TextLog::Print(dump,L" Unset\n");
      }
      else {
        ON_TextLog::PrintNewLine(dump);
        ON_TextLog::PushIndent(dump);
        ON_FontMetrics::Dump((ON_FontMetrics *)local_98,dump);
        ON_TextLog::PopIndent(dump);
      }
    }
    ON_wString::~ON_wString((ON_wString *)local_d8);
  }
  ON_TextLog::PopIndent(dump);
  ON_wString::~ON_wString((ON_wString *)(local_58 + 8));
  ON_wString::~ON_wString(&local_e8);
  return;
}

Assistant:

void ON_Font::Dump(ON_TextLog& dump) const
{
  const bool bTextHash = dump.IsTextHash();

  ON_wString s;

  if (bTextHash)
  {
    dump.Print(L"Font family name = ...\n");
    dump.PushIndent();
    dump.Print(
      L"The font face name and other properties depend on the platform \n"
      "or the fonts installed on a particular computer. Information like \n"
      "this is omitted from dumps used for SHA-1 hash caluculations so \n"
      "hash values from different platforms and computers can be compared. \n"
    );
  }
  else
  {
    const ON_wString description = Description();
    dump.Print(L"Font description = \"%ls\"\n", static_cast<const wchar_t*>( description ));
    dump.PushIndent();
    
    const ON_wString family_name = FamilyName();
    dump.Print(L"Family name = \"%ls\"\n", static_cast<const wchar_t*>(family_name ));
    const ON_wString en_family_name = FamilyName(ON_Font::NameLocale::English);
    if ( en_family_name.IsNotEmpty() && en_family_name != family_name)
      dump.Print(L"Family name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_family_name ));

    const ON_wString face_name = FaceName();
    dump.Print(L"Face name = \"%ls\"\n", static_cast<const wchar_t*>( face_name ));
    const ON_wString en_face_name = FaceName(ON_Font::NameLocale::English);
    if ( en_face_name.IsNotEmpty() && en_face_name != face_name)
      dump.Print(L"Face name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_face_name ));

    const ON_wString postscript_name = PostScriptName();
    dump.Print(L"PostScript name = \"%ls\"\n", static_cast<const wchar_t*>(postscript_name));
    const ON_wString en_postscript_name = PostScriptName(ON_Font::NameLocale::English);
    if ( en_postscript_name.IsNotEmpty() && en_postscript_name != postscript_name)
      dump.Print(L"PostScript name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_postscript_name ));

    const ON_wString quartet_description = this->QuartetDescription();
    if (quartet_description.IsNotEmpty())
      dump.Print(L"Quartet = %ls\n", static_cast<const wchar_t*>(quartet_description));

    const ON_wString windows_logfont_name = WindowsLogfontName();
    dump.Print(L"Windows LOGFONT name = \"%ls\"\n", static_cast<const wchar_t*>(windows_logfont_name));
    const ON_wString en_windows_logfont_name = WindowsLogfontName(ON_Font::NameLocale::English);
    if ( en_windows_logfont_name.IsNotEmpty() && en_windows_logfont_name != windows_logfont_name)
      dump.Print(L"Windows LOGFONT name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_windows_logfont_name ));

    const ON_wString rich_text_name = ON_Font::RichTextFontName(this, false);
    dump.Print(L"Rich text name = \"%ls\"\n", static_cast<const wchar_t*>(rich_text_name));

    if (this->IsManagedSubstitutedFont())
    {
      const ON_Font* substitute = this->SubstituteFont();
      if (nullptr != substitute)
        dump.Print(L"Installed substitute = %ls\n", static_cast<const wchar_t*>(substitute->Description()));
    }

    s = ON_wString::EmptyString;
    switch (this->FontOrigin())
    {
    case ON_Font::Origin::Unset: break;
    case ON_Font::Origin::Unknown: s = L"Unknown"; break;
    case ON_Font::Origin::WindowsFont: s = L"Windows Font"; break;
    case ON_Font::Origin::AppleFont: s = L"Apple Font";  break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontOrigin())); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Origin = %ls\n", static_cast<const wchar_t*>(s));
    }
       
    s = ON_wString::EmptyString;
    const ON_OutlineFigure::Type outline_figure_type = this->OutlineFigureType();
    switch (outline_figure_type)
    {
    case ON_OutlineFigure::Type::Unset: break;
    case ON_OutlineFigure::Type::Unknown: break;
    case ON_OutlineFigure::Type::SingleStroke: s = L"Engraving - single stroke"; break;
    case ON_OutlineFigure::Type::DoubleStroke: s = L"Engraving - double stroke"; break;
    case ON_OutlineFigure::Type::Perimeter: s = L"Perimeter"; break;
    case ON_OutlineFigure::Type::NotPerimeter: s = L"Not a perimeter"; break;
    case ON_OutlineFigure::Type::Mixed: s = L"Mixed"; break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(outline_figure_type)); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Outline type = %ls\n", static_cast<const wchar_t*>(s));
    }
  }

  if (ON_Font::IsValidPointSize(m_point_size))
  {
    dump.Print(L"PointSize = %g\n", m_point_size);
  }
  else
  {
    dump.Print(L"PointSize = annotation default\n");
  }

  const ON_FontFaceQuartet q = this->FontQuartet();
  const ON_FontFaceQuartet::Member m = q.QuartetMember(this);
  switch (m)
  {
  case ON_FontFaceQuartet::Member::Regular:
    dump.Print("Quartet: %ls (Regular member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Bold:
    dump.Print("Quartet: %ls (Bold member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Italic:
    dump.Print("Quartet: %ls (Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::BoldItalic:
    dump.Print("Quartet: %ls (Bold-Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Unset:
  default:
    dump.Print("Quartet: None\n");
    break;
  }


  s = ON_Font::WeightToWideString(FontWeight());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontWeight()));
  if (SimulatedWeight())
    s += L" (simulated)";
  dump.Print(L"Weight = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StretchToWideString(FontStretch());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStretch()));
  if (SimulatedStretch())
    s += L" (simulated)";
  dump.Print(L"Stretch = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StyleToWideString(FontStyle());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStyle()));
  if (SimulatedStyle())
    s += L" (simulated)";
  dump.Print(L"Style = %ls\n", static_cast<const wchar_t*>(s));

  dump.Print(L"Underlined = %ls\n", this->IsUnderlined() ? L"true" : L"false");

  dump.Print(L"Strikethrough = %ls\n", this->IsStrikethrough() ? L"true" : L"false");

  dump.Print(L"Symbol font = %ls\n", this->IsSymbolFont() ? L"true" : L"false");

  const ON_OutlineFigure::Type font_figure_type = this->OutlineFigureType();
  if (ON_OutlineFigure::Type::SingleStroke == font_figure_type)
    dump.Print(L"Engraving font = Single-stroke\n");
  else if (ON_OutlineFigure::Type::DoubleStroke == font_figure_type)
    dump.Print(L"Engraving font = Double-stroke\n");

  if ( 
    ON_PANOSE1::FamilyKind::Any != m_panose1.PANOSE1FamilyKind()
    && ON_PANOSE1::FamilyKind::NoFit != m_panose1.PANOSE1FamilyKind()
    )
  {
    // PANOSE1 may contains some useful information
    m_panose1.Dump(dump);
  }


  if (false == bTextHash)
  {
    const ON_wString characteristics_hash = FontCharacteristicsHash().ToString(true);
    dump.Print(L"Font characteristics SHA-1 hash = %ls\n", static_cast<const wchar_t*>(characteristics_hash));

    unsigned int runtime_sn = RuntimeSerialNumber();
    if (runtime_sn >= 1)
    {
      if (this == &ON_Font::Default)
        dump.Print(L"Managed font <%u> (ON_Font::Default)\n", runtime_sn);
      else if (IsInstalledFont())
      {
        dump.Print(L"Managed font <%u> (face installed on device)\n", runtime_sn);
      }
      else
      {
        dump.Print(L"Managed font <%u> (face not installed on device)\n", runtime_sn);
      }

      for (int fm_pass = 0; fm_pass < 1; fm_pass++)
      {
        const bool bNormalized = (1 == fm_pass);
        const ON_FontMetrics fm
          = bNormalized
          ? FontMetrics()
          : FontUnitFontMetrics();
        dump.Print(bNormalized ? L"Normalized font metrics:" : L"Font metrics:");
        if (fm.IsSet())
        {
          dump.PrintNewLine();
          dump.PushIndent();
          fm.Dump(dump);
          dump.PopIndent();
        }
        else
        {
          dump.Print(L" Unset\n");
        }
      }
    }

#if defined(ON_OS_WINDOWS_GDI)
    {
      const LOGFONT logfont = this->WindowsLogFont(0, nullptr);
      ON_Font::DumpLogfont(&logfont, dump);
    }
#elif defined (ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
    {
      bool bIsSubstituteFont = false;
      CTFontRef apple_font = AppleCTFont(bIsSubstituteFont);
      if (bIsSubstituteFont)
        dump.Print(L"Apple Core Text font (substitute):\n");
      else
        dump.Print(L"Apple Core Text font:\n");
      dump.PushIndent();
      ON_Font::DumpCTFont(apple_font, dump);
      dump.PopIndent();
      if (nullptr != apple_font && ON_Font::Origin::AppleFont == m_font_origin)
      {
        if (m_apple_font_weight_trait >= -1.0 && m_apple_font_weight_trait <= 1.0)
          dump.Print(L"Apple font weight trait = %g\n", m_apple_font_weight_trait);
        if (m_apple_font_width_trait >= -1.0 && m_apple_font_width_trait <= 1.0)
          dump.Print(L"Apple font width trait = %g\n", m_apple_font_width_trait);
      }
    }
#elif defined(OPENNURBS_FREETYPE_SUPPORT)
// Look in opennurbs_system_rumtime.h for the correct place to define OPENNURBS_FREETYPE_SUPPORT.
// Do NOT define OPENNURBS_FREETYPE_SUPPORT here or in your project setting ("makefile").
    if (runtime_sn >= 1)
    {
      // Free Type font details
      DumpFreeType(dump);
    }
#endif
  }
  dump.PopIndent();
}